

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

int cpu_memory_rw_debug_mips64
              (CPUState *cpu,target_ulong_conflict addr,void *ptr,target_ulong_conflict len,
              _Bool is_write)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var2;
  AddressSpace *as;
  uint uVar3;
  hwaddr hVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  undefined4 in_register_00000034;
  undefined7 in_register_00000081;
  ulong len_00;
  ulong uVar6;
  ulong uVar7;
  MemTxAttrs attrs;
  MemTxAttrs in_stack_ffffffffffffffb8;
  MemTxAttrs local_40;
  undefined4 local_3c;
  CPUState *local_38;
  
  uVar6 = CONCAT44(in_register_00000034,addr);
  uVar7 = CONCAT44(in_register_0000000c,len);
  local_3c = (undefined4)CONCAT71(in_register_00000081,is_write);
  do {
    if (uVar7 == 0) {
      return 0;
    }
    uVar5 = uVar6 & 0xfffffffffffff000;
    p_Var1 = cpu->cc->get_phys_page_attrs_debug;
    local_38 = cpu;
    if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
      local_40 = (MemTxAttrs)0x1;
      hVar4 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,uVar5);
    }
    else {
      hVar4 = (*p_Var1)((CPUState_conflict *)cpu,uVar5,&local_40);
    }
    p_Var2 = cpu->cc->asidx_from_attrs;
    if (p_Var2 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (*p_Var2)((CPUState_conflict *)cpu,in_stack_ffffffffffffffb8);
      if (((int)uVar3 < 0) || (cpu->num_ases <= (int)uVar3)) {
        __assert_fail("ret < cpu->num_ases && ret >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                      ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
      }
    }
    if (hVar4 == 0xffffffffffffffff) {
      return -1;
    }
    len_00 = (uVar5 + 0x1000) - uVar6;
    if (uVar7 <= len_00) {
      len_00 = uVar7;
    }
    hVar4 = hVar4 + ((uint)uVar6 & 0xfff);
    as = cpu->cpu_ases[uVar3].as;
    if ((char)local_3c == '\0') {
      if (uVar5 + 0x1000 != uVar6) {
        flatview_read((uc_struct_conflict6 *)as->uc,as->current_map,hVar4,local_40,ptr,len_00);
      }
    }
    else {
      address_space_write_rom_mips64(as,hVar4,local_40,ptr,len_00);
    }
    ptr = (void *)((long)ptr + len_00);
    uVar6 = uVar6 + len_00;
    uVar7 = uVar7 - len_00;
    cpu = local_38;
  } while( true );
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}